

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef __thiscall
anon_unknown.dwarf_d5a34::find_first_component
          (anon_unknown_dwarf_d5a34 *this,StringRef path,Style style)

{
  StringRef SVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  Style SVar6;
  int iVar7;
  unsigned_long *puVar8;
  char *pcVar9;
  Style style_00;
  anon_unknown_dwarf_d5a34 *paVar10;
  StringRef local_1b8;
  size_t end;
  size_t end_1;
  undefined1 auStack_180 [4];
  Style style_local;
  StringRef path_local;
  unsigned_long local_168;
  unsigned_long local_130;
  size_type local_128;
  unsigned_long local_120;
  StringRef *local_118;
  unsigned_long local_100 [3];
  undefined1 *local_e8;
  unsigned_long local_d0;
  size_type local_c8;
  unsigned_long local_c0;
  StringRef *local_b8;
  unsigned_long local_a0 [3];
  undefined1 *local_88;
  undefined1 *local_70;
  
  path_local.Data = path.Data;
  style_00 = (Style)path.Length;
  local_70 = auStack_180;
  if (path_local.Data == (char *)0x0) {
    local_168 = 0;
    path_local.Length = (size_t)this;
  }
  else {
    _auStack_180 = this;
    SVar6 = real_style(style_00);
    if ((SVar6 == windows) && ((char *)0x1 < path_local.Data)) {
      bVar2 = llvm::StringRef::operator[]((StringRef *)auStack_180,0);
      iVar7 = isalpha((uint)bVar2);
      if ((iVar7 != 0) &&
         (cVar3 = llvm::StringRef::operator[]((StringRef *)auStack_180,1), cVar3 == ':')) {
        local_88 = auStack_180;
        local_a0[2] = 0;
        local_a0[1] = 2;
        puVar8 = std::min<unsigned_long>(local_a0 + 2,(unsigned_long *)&path_local);
        local_a0[2] = *puVar8;
        paVar10 = _auStack_180 + local_a0[2];
        local_a0[0] = (long)path_local.Data - local_a0[2];
        puVar8 = std::min<unsigned_long>(local_a0 + 1,local_a0);
        local_168 = *puVar8;
        path_local.Length = (size_t)paVar10;
        goto LAB_00198585;
      }
    }
    if ((char *)0x2 < path_local.Data) {
      cVar3 = llvm::StringRef::operator[]((StringRef *)auStack_180,0);
      bVar4 = llvm::sys::path::is_separator(cVar3,style_00);
      if (bVar4) {
        cVar3 = llvm::StringRef::operator[]((StringRef *)auStack_180,0);
        cVar5 = llvm::StringRef::operator[]((StringRef *)auStack_180,1);
        if (cVar3 == cVar5) {
          cVar3 = llvm::StringRef::operator[]((StringRef *)auStack_180,2);
          bVar4 = llvm::sys::path::is_separator(cVar3,style_00);
          if (!bVar4) {
            pcVar9 = separators(style_00);
            end = (size_t)pcVar9;
            if (pcVar9 != (char *)0x0) {
              strlen(pcVar9);
            }
            local_c8 = llvm::StringRef::find_first_of((StringRef *)auStack_180,_end,2);
            local_c0 = 0;
            local_b8 = (StringRef *)auStack_180;
            puVar8 = std::min<unsigned_long>(&local_c0,(unsigned_long *)&path_local);
            local_c0 = *puVar8;
            paVar10 = _auStack_180 + local_c0;
            local_d0 = (long)path_local.Data - local_c0;
            puVar8 = std::min<unsigned_long>(&local_c8,&local_d0);
            local_168 = *puVar8;
            path_local.Length = (size_t)paVar10;
            goto LAB_00198585;
          }
        }
      }
    }
    cVar3 = llvm::StringRef::operator[]((StringRef *)auStack_180,0);
    bVar4 = llvm::sys::path::is_separator(cVar3,style_00);
    if (bVar4) {
      local_e8 = auStack_180;
      local_100[2] = 0;
      local_100[1] = 1;
      puVar8 = std::min<unsigned_long>(local_100 + 2,(unsigned_long *)&path_local);
      local_100[2] = *puVar8;
      paVar10 = _auStack_180 + local_100[2];
      local_100[0] = (long)path_local.Data - local_100[2];
      puVar8 = std::min<unsigned_long>(local_100 + 1,local_100);
      local_168 = *puVar8;
      path_local.Length = (size_t)paVar10;
    }
    else {
      pcVar9 = separators(style_00);
      local_1b8.Data = pcVar9;
      if (pcVar9 != (char *)0x0) {
        strlen(pcVar9);
      }
      local_128 = llvm::StringRef::find_first_of((StringRef *)auStack_180,local_1b8,0);
      local_120 = 0;
      local_118 = (StringRef *)auStack_180;
      puVar8 = std::min<unsigned_long>(&local_120,(unsigned_long *)&path_local);
      local_120 = *puVar8;
      paVar10 = _auStack_180 + local_120;
      local_130 = (long)path_local.Data - local_120;
      puVar8 = std::min<unsigned_long>(&local_128,&local_130);
      local_168 = *puVar8;
      path_local.Length = (size_t)paVar10;
    }
  }
LAB_00198585:
  SVar1.Length = local_168;
  SVar1.Data = (char *)path_local.Length;
  return SVar1;
}

Assistant:

StringRef find_first_component(StringRef path, Style style) {
    // Look for this first component in the following order.
    // * empty (in this case we return an empty string)
    // * either C: or {//,\\}net.
    // * {/,\}
    // * {file,directory}name

    if (path.empty())
      return path;

    if (real_style(style) == Style::windows) {
      // C:
      if (path.size() >= 2 &&
          std::isalpha(static_cast<unsigned char>(path[0])) && path[1] == ':')
        return path.substr(0, 2);
    }

    // //net
    if ((path.size() > 2) && is_separator(path[0], style) &&
        path[0] == path[1] && !is_separator(path[2], style)) {
      // Find the next directory separator.
      size_t end = path.find_first_of(separators(style), 2);
      return path.substr(0, end);
    }

    // {/,\}
    if (is_separator(path[0], style))
      return path.substr(0, 1);

    // * {file,directory}name
    size_t end = path.find_first_of(separators(style));
    return path.substr(0, end);
  }